

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

bool vkt::sparse::isImageSizeSupported
               (InstanceInterface *instance,VkPhysicalDevice physicalDevice,ImageType imageType,
               UVec3 *imageSize)

{
  uint uVar1;
  bool local_376;
  bool local_375;
  bool local_374;
  bool local_373;
  bool local_372;
  bool local_371;
  undefined1 local_368 [8];
  VkPhysicalDeviceProperties deviceProperties;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *instance_local;
  
  deviceProperties._816_8_ = imageSize;
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_368,instance,physicalDevice)
  ;
  switch(imageType) {
  case IMAGE_TYPE_1D:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    instance_local._7_1_ = uVar1 <= (uint)deviceProperties.pipelineCacheUUID._12_4_;
    break;
  case IMAGE_TYPE_1D_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_371 = false;
    if (uVar1 <= (uint)deviceProperties.pipelineCacheUUID._12_4_) {
      uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_371 = uVar1 <= deviceProperties.limits.maxImageDimension3D;
    }
    instance_local._7_1_ = local_371;
    break;
  case IMAGE_TYPE_2D:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_372 = false;
    if (uVar1 <= (uint)deviceProperties._292_4_) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_372 = uVar1 <= (uint)deviceProperties._292_4_;
    }
    instance_local._7_1_ = local_372;
    break;
  case IMAGE_TYPE_2D_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_373 = false;
    if (uVar1 <= (uint)deviceProperties._292_4_) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_373 = false;
      if (uVar1 <= (uint)deviceProperties._292_4_) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)deviceProperties._816_8_)
        ;
        local_373 = uVar1 <= deviceProperties.limits.maxImageDimension3D;
      }
    }
    instance_local._7_1_ = local_373;
    break;
  case IMAGE_TYPE_3D:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_376 = false;
    if (uVar1 <= deviceProperties.limits.maxImageDimension1D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_376 = false;
      if (uVar1 <= deviceProperties.limits.maxImageDimension1D) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)deviceProperties._816_8_)
        ;
        local_376 = uVar1 <= deviceProperties.limits.maxImageDimension1D;
      }
    }
    instance_local._7_1_ = local_376;
    break;
  case IMAGE_TYPE_CUBE:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_374 = false;
    if (uVar1 <= deviceProperties.limits.maxImageDimension2D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_374 = uVar1 <= deviceProperties.limits.maxImageDimension2D;
    }
    instance_local._7_1_ = local_374;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
    local_375 = false;
    if (uVar1 <= deviceProperties.limits.maxImageDimension2D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)deviceProperties._816_8_);
      local_375 = false;
      if (uVar1 <= deviceProperties.limits.maxImageDimension2D) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)deviceProperties._816_8_)
        ;
        local_375 = uVar1 <= deviceProperties.limits.maxImageDimension3D;
      }
    }
    instance_local._7_1_ = local_375;
    break;
  case IMAGE_TYPE_BUFFER:
    instance_local._7_1_ = true;
    break;
  default:
    instance_local._7_1_ = false;
  }
  return instance_local._7_1_;
}

Assistant:

bool isImageSizeSupported (const InstanceInterface& instance, const VkPhysicalDevice physicalDevice, const ImageType imageType, const tcu::UVec3& imageSize)
{
	const VkPhysicalDeviceProperties deviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);

	switch (imageType)
	{
		case IMAGE_TYPE_1D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension1D;
		case IMAGE_TYPE_1D_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension1D &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_2D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension2D;
		case IMAGE_TYPE_2D_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_CUBE:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.y() <= deviceProperties.limits.maxImageDimensionCube;
		case IMAGE_TYPE_CUBE_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.y() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_3D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension3D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension3D &&
					imageSize.z() <= deviceProperties.limits.maxImageDimension3D;
		case IMAGE_TYPE_BUFFER:
			return true;
		default:
			DE_FATAL("Unknown image type");
			return false;
	}
}